

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall SmallVector_AssignCopy_Test::TestBody(SmallVector_AssignCopy_Test *this)

{
  initializer_list<int> init;
  bool bVar1;
  char *message;
  _Tuple_impl<0UL,_int,_int> in_stack_ffffffffffffff00;
  AssertHelper local_e0;
  Message local_d8;
  int local_d0 [2];
  testing local_c8 [8];
  char local_c0 [8];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_98 [8];
  small_vector<int,_3UL> c;
  undefined1 local_48 [8];
  small_vector<int,_3UL> b;
  SmallVector_AssignCopy_Test *this_local;
  
  c.buffer_._0_4_ = 5;
  c.buffer_._4_4_ = 7;
  init._M_len = 2;
  init._M_array = (iterator)&c.buffer_;
  b.buffer_ = (int *)this;
  pstore::small_vector<int,_3UL>::small_vector((small_vector<int,_3UL> *)local_48,init);
  pstore::small_vector<int,_3UL>::small_vector((small_vector<int,_3UL> *)local_98);
  pstore::small_vector<int,_3UL>::operator=
            ((small_vector<int,_3UL> *)local_98,(small_vector<int,_3UL> *)local_48);
  local_d0[1] = 5;
  local_d0[0] = 7;
  testing::ElementsAre<int,int>(local_c8,local_d0 + 1,local_d0);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>
            ((ElementsAreMatcher<std::tuple<int,_int>_>)in_stack_ffffffffffffff00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>::
  operator()(local_b8,local_c0,(small_vector<int,_3UL> *)0x2b3ec1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x60,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  pstore::small_vector<int,_3UL>::~small_vector((small_vector<int,_3UL> *)local_98);
  pstore::small_vector<int,_3UL>::~small_vector((small_vector<int,_3UL> *)local_48);
  return;
}

Assistant:

TEST (SmallVector, AssignCopy) {
    pstore::small_vector<int, 3> const b{5, 7};
    pstore::small_vector<int, 3> c;
    c = b;
    EXPECT_THAT (c, ::testing::ElementsAre (5, 7));
}